

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O2

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:410:34)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:410:34)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  SceneLoadingTutorialApplication *pSVar1;
  bool bVar2;
  runtime_error *this_01;
  InstancingMode IVar3;
  string mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pSVar1 = (this->f).this;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&mode,&this_00->
                    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  bVar2 = std::operator==(&mode,"none");
  IVar3 = INSTANCING_NONE;
  if (!bVar2) {
    bVar2 = std::operator==(&mode,"scene_geometry");
    IVar3 = INSTANCING_GEOMETRY;
    if (!bVar2) {
      bVar2 = std::operator==(&mode,"scene_group");
      IVar3 = INSTANCING_GROUP;
      if (((!bVar2) &&
          (bVar2 = std::operator==(&mode,"geometry"), IVar3 = INSTANCING_GEOMETRY, !bVar2)) &&
         (bVar2 = std::operator==(&mode,"group"), IVar3 = INSTANCING_GROUP, !bVar2)) {
        bVar2 = std::operator==(&mode,"flattened");
        if (bVar2) {
          IVar3 = INSTANCING_FLATTENED;
        }
        else {
          bVar2 = std::operator==(&mode,"multi_level");
          if (!bVar2) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_40,"unknown instancing mode: ",&mode);
            std::runtime_error::runtime_error(this_01,(string *)&local_40);
            __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          IVar3 = INSTANCING_MULTI_LEVEL;
        }
      }
    }
  }
  pSVar1->instancing_mode = IVar3;
  g_instancing_mode = IVar3;
  std::__cxx11::string::~string((string *)&mode);
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }